

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

void luby_test(void)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int __exponent;
  double dVar6;
  
  uVar5 = 0;
  do {
    uVar3 = 0;
    __exponent = 0;
    if (uVar5 != 0) {
      iVar2 = 1;
      __exponent = 0;
      do {
        __exponent = __exponent + 1;
        uVar3 = iVar2 * 2;
        iVar2 = iVar2 * 2 + 1;
      } while ((int)uVar3 < (int)uVar5);
    }
    uVar4 = (ulong)uVar5;
    if (uVar3 != uVar5) {
      do {
        __exponent = __exponent + -1;
        uVar1 = (long)(int)uVar4 % (long)((int)uVar3 >> 1);
        uVar4 = uVar1 & 0xffffffff;
        uVar3 = ((int)uVar3 >> 1) - 1;
      } while (uVar3 != (uint)uVar1);
    }
    dVar6 = ldexp(1.0,__exponent);
    printf("%d ",(ulong)(uint)(int)dVar6);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  putchar(10);
  return;
}

Assistant:

void luby_test()
{
    int i;
    for ( i = 0; i < 20; i++ )
        printf( "%d ", (int)luby(2,i) );
    printf( "\n" );
}